

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O2

int __thiscall google::protobuf::internal::SooRep::size(SooRep *this,bool is_soo)

{
  uint uVar1;
  string *psVar2;
  bool local_19;
  LogMessageFatal local_18 [16];
  
  local_18[0] = (LogMessageFatal)
                ((undefined1  [16])((undefined1  [16])this->field_0 & (undefined1  [16])0x4) ==
                (undefined1  [16])0x0);
  local_19 = is_soo;
  psVar2 = absl::lts_20240722::log_internal::Check_EQImpl<bool,bool>
                     (&local_19,(bool *)local_18,"is_soo == this->is_soo()");
  if (psVar2 == (string *)0x0) {
    if (local_19 == false) {
      uVar1 = (this->field_0).long_rep.size;
    }
    else {
      uVar1 = *(uint *)&this->field_0 & 3;
    }
    return uVar1;
  }
  absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
            (local_18,
             "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/repeated_field.h"
             ,0xc5,psVar2->_M_string_length,(psVar2->_M_dataplus)._M_p);
  absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_18);
}

Assistant:

int size(bool is_soo) const {
    ABSL_DCHECK_EQ(is_soo, this->is_soo());
#if !defined(__clang__) && defined(__GNUC__)
#pragma GCC diagnostic push
#pragma GCC diagnostic ignored "-Wmaybe-uninitialized"
#endif
    return is_soo ? short_rep.size() : long_rep.size;
#if !defined(__clang__) && defined(__GNUC__)
#pragma GCC diagnostic pop
#endif
  }